

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O2

void __thiscall Js::JavascriptExceptionObject::FillStackBackTrace(JavascriptExceptionObject *this)

{
  ScriptContext *pSVar1;
  Recycler *alloc;
  StackBackTrace *ptr;
  AutoNestedHandledExceptionType local_1c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (((this->stackBackTrace).ptr == (StackBackTrace *)0x0) &&
     (pSVar1 = (this->scriptContext).ptr, pSVar1 != (ScriptContext *)0x0)) {
    alloc = pSVar1->threadContext->recycler;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_1c,ExceptionType_OutOfMemory);
    ptr = StackBackTrace::Capture<Memory::Recycler>(alloc,2,0x1e);
    Memory::WriteBarrierPtr<StackBackTrace>::WriteBarrierSet(&this->stackBackTrace,ptr);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_1c);
  }
  return;
}

Assistant:

void JavascriptExceptionObject::FillStackBackTrace()
    {
        // Note: this->scriptContext can be NULL when we throw Out Of Memory exception.
        if (this->stackBackTrace == NULL && this->scriptContext != NULL)
        {
            Recycler* recycler = scriptContext->GetThreadContext()->GetRecycler();
            HRESULT hr = NOERROR;
            BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
            {
                this->stackBackTrace = StackBackTrace::Capture(recycler, JavascriptExceptionObject::StackToSkip, JavascriptExceptionObject::StackTraceDepth);
            }
            END_TRANSLATE_OOM_TO_HRESULT(hr)
        }
    }